

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_stopwatch_stop(REF_MPI ref_mpi,char *message)

{
  clock_t cVar1;
  REF_STATUS ref_private_macro_code_rss;
  clock_t ticks;
  char *message_local;
  REF_MPI ref_mpi_local;
  
  cVar1 = clock();
  printf("%9.4f: %10.6f (%10.6f) %6.2f%% %s\n",(double)cVar1 / 1000000.0 - ref_mpi->first_time,
         (double)cVar1 / 1000000.0 - ref_mpi->start_time,
         (double)cVar1 / 1000000.0 - ref_mpi->start_time,0x405b800000000000,message);
  fflush(_stdout);
  ref_mpi_local._4_4_ = ref_mpi_stopwatch_start(ref_mpi);
  if (ref_mpi_local._4_4_ == 0) {
    ref_mpi_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x136,
           "ref_mpi_stopwatch_stop",(ulong)ref_mpi_local._4_4_,"restart");
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_stopwatch_stop(REF_MPI ref_mpi,
                                          const char *message) {
#ifdef HAVE_MPI
  REF_DBL before_barrier, after_barrier, elapsed;
  REF_DBL first, last;
  before_barrier = (REF_DBL)MPI_Wtime() - ref_mpi->start_time;
  if (ref_mpi_para(ref_mpi)) MPI_Barrier(ref_mpi_comm(ref_mpi));
  after_barrier = (REF_DBL)MPI_Wtime();
  elapsed = after_barrier - ref_mpi->first_time;
  after_barrier = after_barrier - ref_mpi->start_time;
  RSS(ref_mpi_min(ref_mpi, &before_barrier, &first, REF_DBL_TYPE), "min");
  RSS(ref_mpi_min(ref_mpi, &after_barrier, &last, REF_DBL_TYPE), "max");
  if (ref_mpi_once(ref_mpi)) {
    printf("%9.4f: %10.6f (%10.6f) %6.2f%% %s\n", elapsed, last, first,
           (last > 0.0 ? first / last * 100.0 : 100.0), message);
    fflush(stdout);
  }
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#else
  clock_t ticks;
  ticks = clock();
  printf("%9.4f: %10.6f (%10.6f) %6.2f%% %s\n",
         ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->first_time,
         ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->start_time,
         ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->start_time,
         110.0, message);
  fflush(stdout);
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#endif

  return REF_SUCCESS;
}